

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::MultisampleCase::renderLine
          (MultisampleCase *this,Vec2 *p0,Vec2 *p1,Vec4 *color)

{
  GLenum GVar1;
  float vertexColors [8];
  float vertexPositions [8];
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  undefined8 local_40;
  float local_38;
  float local_34;
  undefined8 local_30;
  
  local_48 = p0->m_data[0];
  local_44 = p0->m_data[1];
  local_40 = 0x3f80000000000000;
  local_38 = p1->m_data[0];
  local_34 = p1->m_data[1];
  local_30 = 0x3f80000000000000;
  local_68 = color->m_data[0];
  local_64 = color->m_data[1];
  local_60 = color->m_data[2];
  local_5c = color->m_data[3];
  local_58 = local_68;
  local_54 = local_64;
  local_50 = local_60;
  local_4c = local_5c;
  glwEnableVertexAttribArray(this->m_attrPositionLoc);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glEnableVertexAttribArray(m_attrPositionLoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x127);
  glwVertexAttribPointer(this->m_attrPositionLoc,4,0x1406,'\0',0,&local_48);
  GVar1 = glwGetError();
  glu::checkError(GVar1,
                  "glVertexAttribPointer(m_attrPositionLoc, 4, GL_FLOAT, false, 0, &vertexPositions[0])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x128);
  glwEnableVertexAttribArray(this->m_attrColorLoc);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glEnableVertexAttribArray(m_attrColorLoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x12a);
  glwVertexAttribPointer(this->m_attrColorLoc,4,0x1406,'\0',0,&local_68);
  GVar1 = glwGetError();
  glu::checkError(GVar1,
                  "glVertexAttribPointer(m_attrColorLoc, 4, GL_FLOAT, false, 0, &vertexColors[0])",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,299);
  glwUseProgram((this->m_program->m_program).m_program);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glUseProgram(m_program->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x12d);
  glwDrawArrays(1,0,2);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glDrawArrays(GL_LINES, 0, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x12e);
  return;
}

Assistant:

void MultisampleCase::renderLine (const Vec2& p0, const Vec2& p1, const Vec4& color) const
{
	float vertexPositions[] =
	{
		p0.x(), p0.y(), 0.0f, 1.0f,
		p1.x(), p1.y(), 0.0f, 1.0f
	};
	float vertexColors[] =
	{
		color.x(), color.y(), color.z(), color.w(),
		color.x(), color.y(), color.z(), color.w()
	};

	GLU_CHECK_CALL(glEnableVertexAttribArray(m_attrPositionLoc));
	GLU_CHECK_CALL(glVertexAttribPointer(m_attrPositionLoc, 4, GL_FLOAT, false, 0, &vertexPositions[0]));

	GLU_CHECK_CALL(glEnableVertexAttribArray(m_attrColorLoc));
	GLU_CHECK_CALL(glVertexAttribPointer(m_attrColorLoc, 4, GL_FLOAT, false, 0, &vertexColors[0]));

	GLU_CHECK_CALL(glUseProgram(m_program->getProgram()));
	GLU_CHECK_CALL(glDrawArrays(GL_LINES, 0, 2));
}